

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSON.cxx
# Opt level: O2

ReadFileResult cmCMakePresetsGraphInternal::PresetStringHelper(string *out,Value *value)

{
  ReadFileResult RVar1;
  int iVar2;
  allocator<char> local_31;
  string local_30;
  
  if (PresetStringHelper(std::__cxx11::string&,Json::Value_const*)::helper_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&PresetStringHelper(std::__cxx11::string&,Json::Value_const*)::
                                 helper_abi_cxx11_);
    if (iVar2 != 0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"",&local_31);
      cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::String
                (&PresetStringHelper(std::__cxx11::string&,Json::Value_const*)::helper_abi_cxx11_,
                 READ_OK,INVALID_PRESET,&local_30);
      std::__cxx11::string::~string((string *)&local_30);
      __cxa_atexit(std::_Function_base::~_Function_base,
                   &PresetStringHelper(std::__cxx11::string&,Json::Value_const*)::helper_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&PresetStringHelper(std::__cxx11::string&,Json::Value_const*)::
                           helper_abi_cxx11_);
    }
  }
  RVar1 = std::
          function<cmCMakePresetsGraph::ReadFileResult_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
          ::operator()(&PresetStringHelper(std::__cxx11::string&,Json::Value_const*)::
                        helper_abi_cxx11_,out,value);
  return RVar1;
}

Assistant:

cmCMakePresetsGraph::ReadFileResult PresetStringHelper(
  std::string& out, const Json::Value* value)
{
  static auto const helper = JSONHelperBuilder::String(
    ReadFileResult::READ_OK, ReadFileResult::INVALID_PRESET);

  return helper(out, value);
}